

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O2

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>
     ::send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
               (mbox_t *to,prefix_t *args,suffix_t *args_1,unsigned_long *args_2)

{
  abstract_message_box_t *this;
  quantity<unsigned_long> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false> local_18;
  
  this = to->m_obj;
  local_18._M_head_impl = in_RAX;
  details::make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>>::
  make<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>> *)
             &local_18,args,args_1,args_2);
  abstract_message_box_t::deliver_message<so_5::stats::messages::quantity<unsigned_long>>
            (this,(type_index)&stats::messages::quantity<unsigned_long>::typeinfo,
             (unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
              *)&local_18,immutable_message);
  if (local_18._M_head_impl != (quantity<unsigned_long> *)0x0) {
    (*((local_18._M_head_impl)->super_message_t)._vptr_message_t[1])();
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}